

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int listener_setup_ssl(h2o_configurator_command_t *cmd,h2o_configurator_context_t *ctx,
                      yoml_t *listen_node,yoml_t *ssl_node,listener_config_t *listener,
                      int listener_is_new)

{
  anon_union_24_4_f8a395d4_for_data *paVar1;
  yoml_t_conflict *node;
  yoml_t_conflict *pyVar2;
  h2o_hostconf_t *phVar3;
  listener_ssl_config_t **pplVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  SSL_METHOD *meth;
  SSL_CTX *ctx_00;
  BIO *bp;
  DH *dh;
  listener_ssl_config_t *plVar8;
  void *pvVar9;
  ulong new_capacity;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  byte bVar14;
  yoml_t_conflict *pyVar15;
  h2o_buffer_t **__size;
  yoml_t_conflict **ppyVar16;
  yoml_t_conflict *pyVar17;
  h2o_iovec_t hVar18;
  uint ocsp_max_failures;
  uint64_t ocsp_update_interval;
  char errbuf [256];
  yoml_t_conflict *local_1a8;
  yoml_t_conflict *local_198;
  yoml_t_conflict *local_190;
  ulong local_180;
  yoml_t_conflict *local_170;
  yoml_t_conflict *local_168;
  yoml_t_conflict *local_160;
  yoml_t_conflict *local_158;
  h2o_buffer_t *local_138 [33];
  
  if (listener_is_new == 0) {
    sVar10 = (listener->ssl).size;
    if (ssl_node == (yoml_t *)0x0 && sVar10 != 0) {
      pcVar12 = "cannot accept HTTP; already defined to accept HTTPS";
      ssl_node = listen_node;
      goto LAB_0018d86a;
    }
    if (ssl_node != (yoml_t *)0x0 && sVar10 == 0) {
      pcVar12 = "cannot accept HTTPS; already defined to accept HTTP";
      goto LAB_0018d86a;
    }
  }
  if (ssl_node == (yoml_t *)0x0) {
    return 0;
  }
  if (ssl_node->type != YOML_TYPE_MAPPING) {
    pcVar12 = "`ssl` is not a mapping";
    goto LAB_0018d86a;
  }
  sVar10 = (ssl_node->data).sequence.size;
  if (sVar10 != 0) {
    ppyVar16 = &(ssl_node->data).mapping.elements[0].value;
    local_180 = 0x80000850;
    bVar5 = true;
    local_1a8 = (yoml_t_conflict *)0x0;
    local_170 = (yoml_t_conflict *)0x0;
    local_190 = (yoml_t_conflict *)0x0;
    local_198 = (yoml_t_conflict *)0x0;
    pyVar15 = (yoml_t_conflict *)0x0;
    local_158 = (yoml_t_conflict *)0x0;
    pyVar17 = (yoml_t_conflict *)0x0;
    local_168 = (yoml_t_conflict *)0x0;
    local_160 = (yoml_t_conflict *)0x0;
    do {
      node = ((yoml_mapping_element_t *)(ppyVar16 + -1))->key;
      if (node->type != YOML_TYPE_SCALAR) {
        pcVar12 = "command must be a string";
        cmd = (h2o_configurator_command_t *)0x0;
        ssl_node = node;
        goto LAB_0018d86a;
      }
      pyVar2 = *ppyVar16;
      pcVar12 = (node->data).scalar;
      iVar6 = strcmp(pcVar12,"certificate-file");
      if (iVar6 == 0) {
        local_1a8 = pyVar2;
        if (pyVar2->type != YOML_TYPE_SCALAR) {
          pcVar12 = "property of `certificate-file` must be a string";
          ssl_node = pyVar2;
          goto LAB_0018d86a;
        }
      }
      else {
        iVar6 = strcmp(pcVar12,"key-file");
        if (iVar6 == 0) {
          local_170 = pyVar2;
          if (pyVar2->type != YOML_TYPE_SCALAR) {
            pcVar12 = "property of `key-file` must be a string";
            ssl_node = pyVar2;
            goto LAB_0018d86a;
          }
        }
        else {
          iVar6 = strcmp(pcVar12,"min-version");
          if (iVar6 == 0) {
            local_198 = pyVar2;
            if (pyVar2->type != YOML_TYPE_SCALAR) {
              pcVar12 = "property of `min-version` must be a string";
              ssl_node = pyVar2;
              goto LAB_0018d86a;
            }
          }
          else {
            iVar6 = strcmp(pcVar12,"minimum-version");
            if (iVar6 == 0) {
              local_198 = pyVar2;
              if (pyVar2->type != YOML_TYPE_SCALAR) {
                pcVar12 = "property of `minimum-version` must be a string";
                ssl_node = pyVar2;
                goto LAB_0018d86a;
              }
            }
            else {
              iVar6 = strcmp(pcVar12,"max-version");
              if (iVar6 == 0) {
                pyVar15 = pyVar2;
                if (pyVar2->type != YOML_TYPE_SCALAR) {
                  pcVar12 = "property of `max-version` must be a string";
                  ssl_node = pyVar2;
                  goto LAB_0018d86a;
                }
              }
              else {
                iVar6 = strcmp(pcVar12,"maximum-version");
                if (iVar6 == 0) {
                  pyVar15 = pyVar2;
                  if (pyVar2->type != YOML_TYPE_SCALAR) {
                    pcVar12 = "property of `maximum-version` must be a string";
                    ssl_node = pyVar2;
                    goto LAB_0018d86a;
                  }
                }
                else {
                  iVar6 = strcmp(pcVar12,"cipher-suite");
                  if (iVar6 == 0) {
                    local_158 = pyVar2;
                    if (pyVar2->type != YOML_TYPE_SCALAR) {
                      pcVar12 = "property of `cipher-suite` must be a string";
                      ssl_node = pyVar2;
                      goto LAB_0018d86a;
                    }
                  }
                  else {
                    iVar6 = strcmp(pcVar12,"ocsp-update-cmd");
                    if (iVar6 == 0) {
                      pyVar17 = pyVar2;
                      if (pyVar2->type != YOML_TYPE_SCALAR) {
                        pcVar12 = "property of `ocsp-update-cmd` must be a string";
                        ssl_node = pyVar2;
                        goto LAB_0018d86a;
                      }
                    }
                    else {
                      iVar6 = strcmp(pcVar12,"ocsp-update-interval");
                      if (iVar6 == 0) {
                        local_168 = pyVar2;
                        if (pyVar2->type != YOML_TYPE_SCALAR) {
                          pcVar12 = "property of `ocsp-update-interval` must be a string";
                          ssl_node = pyVar2;
                          goto LAB_0018d86a;
                        }
                      }
                      else {
                        iVar6 = strcmp(pcVar12,"ocsp-max-failures");
                        if (iVar6 == 0) {
                          local_160 = pyVar2;
                          if (pyVar2->type != YOML_TYPE_SCALAR) {
                            pcVar12 = "property of `ocsp-max-failures` must be a string";
                            ssl_node = pyVar2;
                            goto LAB_0018d86a;
                          }
                        }
                        else {
                          iVar6 = strcmp(pcVar12,"dh-file");
                          if (iVar6 == 0) {
                            local_190 = pyVar2;
                            if (pyVar2->type != YOML_TYPE_SCALAR) {
                              pcVar12 = "property of `dh-file` must be a string";
                              ssl_node = pyVar2;
                              goto LAB_0018d86a;
                            }
                          }
                          else {
                            iVar6 = strcmp(pcVar12,"cipher-preference");
                            if (iVar6 == 0) {
                              if (pyVar2->type != YOML_TYPE_SCALAR) {
LAB_0018dee7:
                                pcVar12 = 
                                "property of `cipher-preference` must be either of: `client`, `server`"
                                ;
                                ssl_node = pyVar2;
                                goto LAB_0018d86a;
                              }
                              pcVar12 = (pyVar2->data).scalar;
                              iVar6 = strcasecmp(pcVar12,"client");
                              if (iVar6 == 0) {
                                local_180 = local_180 & 0xffffffffffbfffff;
                              }
                              else {
                                iVar6 = strcasecmp(pcVar12,"server");
                                if (iVar6 != 0) goto LAB_0018dee7;
                                local_180 = local_180 | 0x400000;
                              }
                            }
                            else {
                              iVar6 = strcmp(pcVar12,"neverbleed");
                              if (iVar6 != 0) {
                                h2o_configurator_errprintf(cmd,node,"unknown property: %s",pcVar12);
                                return -1;
                              }
                              if (pyVar2->type != YOML_TYPE_SCALAR) {
LAB_0018ddc4:
                                pcVar12 = "property of `neverbleed` must be either of: `ON`, `OFF";
                                ssl_node = pyVar2;
                                goto LAB_0018d86a;
                              }
                              pcVar12 = (pyVar2->data).scalar;
                              iVar6 = strcasecmp(pcVar12,"ON");
                              if (iVar6 == 0) {
                                bVar5 = true;
                              }
                              else {
                                iVar6 = strcasecmp(pcVar12,"OFF");
                                bVar5 = false;
                                if (iVar6 != 0) goto LAB_0018ddc4;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      ppyVar16 = ppyVar16 + 2;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
    if (local_1a8 != (yoml_t_conflict *)0x0) {
      if (local_170 == (yoml_t_conflict *)0x0) {
        pcVar12 = "could not find mandatory property `key-file`";
        goto LAB_0018d86a;
      }
      if (local_198 == (yoml_t_conflict *)0x0) {
LAB_0018d8b6:
        local_180 = local_180 | 0x2000000;
      }
      else {
        pcVar12 = (local_198->data).scalar;
        iVar6 = strcasecmp(pcVar12,"sslv2");
        if ((iVar6 != 0) && (iVar6 = strcasecmp(pcVar12,"sslv3"), iVar6 != 0)) {
          iVar6 = strcasecmp(pcVar12,"tlsv1");
          if (iVar6 == 0) goto LAB_0018d8b6;
          iVar6 = strcasecmp(pcVar12,"tlsv1.1");
          if (iVar6 == 0) {
            local_180 = local_180 | 0x6000000;
          }
          else {
            iVar6 = strcasecmp(pcVar12,"tlsv1.2");
            if (iVar6 == 0) {
              local_180 = local_180 | 0x16000000;
            }
            else {
              iVar6 = strcasecmp(pcVar12,"tlsv1.3");
              if (iVar6 == 0) {
                local_180 = local_180 | 0x1e000000;
              }
              else {
                h2o_configurator_errprintf(cmd,local_198,"unknown protocol version: %s");
              }
            }
          }
        }
      }
      if (pyVar15 == (yoml_t_conflict *)0x0) {
        bVar14 = 0;
      }
      else {
        iVar6 = strcasecmp((pyVar15->data).scalar,"tlsv1.3");
        bVar14 = (byte)((uint)iVar6 >> 0x1f);
      }
      if ((local_168 != (yoml_t_conflict *)0x0) &&
         (iVar6 = h2o_configurator_scanf(cmd,local_168,"%lu"), iVar6 != 0)) {
        return -1;
      }
      if ((local_160 != (yoml_t_conflict *)0x0) &&
         (iVar6 = h2o_configurator_scanf(cmd,local_160,"%u"), iVar6 != 0)) {
        return -1;
      }
      phVar3 = ctx->hostconf;
      if ((phVar3 != (h2o_hostconf_t *)0x0) && (sVar10 = (listener->ssl).size, sVar10 != 0)) {
        pplVar4 = (listener->ssl).entries;
        pcVar12 = (local_1a8->data).scalar;
        sVar13 = 0;
        do {
          plVar8 = pplVar4[sVar13];
          iVar6 = strcmp(plVar8->certificate_file,pcVar12);
          if (iVar6 == 0) {
            listener_setup_ssl_add_host(plVar8,(phVar3->authority).hostport);
            return 0;
          }
          sVar13 = sVar13 + 1;
        } while (sVar10 != sVar13);
      }
      meth = (SSL_METHOD *)TLS_server_method();
      ctx_00 = SSL_CTX_new(meth);
      SSL_CTX_set_options(ctx_00,local_180 | 0x20000);
      iVar6 = SSL_CTX_use_certificate_chain_file(ctx_00,(local_1a8->data).scalar);
      if (iVar6 == 1) {
        if ((bVar5) && (1 < conf.run_mode - RUN_MODE_MASTER)) {
          if (neverbleed == (neverbleed_t *)0x0) {
            neverbleed = (neverbleed_t *)h2o_mem_alloc(0xa0);
            iVar6 = neverbleed_init(neverbleed,(char *)local_138);
            if (iVar6 != 0) {
              __size = local_138;
              listener_setup_ssl_cold_1();
              pvVar9 = malloc((size_t)__size);
              if (pvVar9 != (void *)0x0) {
                return (int)pvVar9;
              }
              h2o__fatal(
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                        );
            }
          }
          iVar6 = neverbleed_load_private_key_file
                            (neverbleed,(SSL_CTX *)ctx_00,(local_170->data).scalar,(char *)local_138
                            );
          if (iVar6 != 1) {
            h2o_configurator_errprintf
                      (cmd,local_170,"failed to load private key file:%s:%s\n",
                       (local_170->data).scalar,local_138);
            goto LAB_0018da6d;
          }
        }
        else {
          iVar6 = SSL_CTX_use_PrivateKey_file(ctx_00,(local_170->data).scalar,1);
          if (iVar6 != 1) {
            pcVar12 = (local_170->data).scalar;
            pcVar11 = "failed to load private key file:%s\n";
            goto LAB_0018da50;
          }
        }
        if ((local_158 == (yoml_t_conflict *)0x0) ||
           (iVar6 = SSL_CTX_set_cipher_list(ctx_00,(local_158->data).scalar), iVar6 == 1)) {
          if (local_190 == (yoml_t_conflict *)0x0) {
LAB_0018dbc7:
            h2o_ssl_register_npn_protocols((SSL_CTX *)ctx_00,h2o_npn_protocols);
            h2o_ssl_register_alpn_protocols((SSL_CTX *)ctx_00,h2o_alpn_protocols);
            if ((listener->ssl).size == 1) {
              SSL_CTX_callback_ctrl((SSL_CTX *)(*(listener->ssl).entries)->ctx,0x35,on_sni_callback)
              ;
              SSL_CTX_ctrl((SSL_CTX *)(*(listener->ssl).entries)->ctx,0x36,0,listener);
            }
            plVar8 = (listener_ssl_config_t *)h2o_mem_alloc(0x78);
            (plVar8->hostnames).entries = (h2o_iovec_t *)0x0;
            (plVar8->hostnames).size = 0;
            (plVar8->hostnames).capacity = 0;
            plVar8->certificate_file = (char *)0x0;
            plVar8->ctx = (SSL_CTX *)0x0;
            (plVar8->ocsp_stapling).interval = 0;
            *(undefined8 *)&(plVar8->ocsp_stapling).max_failures = 0;
            (plVar8->ocsp_stapling).cmd = (char *)0x0;
            (plVar8->ocsp_stapling).updater_tid = 0;
            (plVar8->ocsp_stapling).response.mutex.__align = 0;
            *(undefined8 *)((long)&(plVar8->ocsp_stapling).response.mutex + 8) = 0;
            *(undefined8 *)((long)&(plVar8->ocsp_stapling).response.mutex + 0x10) = 0;
            (plVar8->ocsp_stapling).response.mutex.__data.__list.__prev =
                 (__pthread_internal_list *)0x0;
            (plVar8->ocsp_stapling).response.mutex.__data.__list.__next =
                 (__pthread_internal_list *)0x0;
            (plVar8->ocsp_stapling).response.data = (h2o_buffer_t *)0x0;
            sVar10 = (listener->ssl).size;
            new_capacity = sVar10 + 1;
            if ((listener->ssl).capacity < new_capacity) {
              h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)&listener->ssl,8,new_capacity
                                );
              sVar10 = (listener->ssl).size;
              new_capacity = sVar10 + 1;
            }
            paVar1 = &local_1a8->data;
            (listener->ssl).size = new_capacity;
            (listener->ssl).entries[sVar10] = plVar8;
            if (ctx->hostconf != (h2o_hostconf_t *)0x0) {
              listener_setup_ssl_add_host(plVar8,(ctx->hostconf->authority).hostport);
            }
            plVar8->ctx = (SSL_CTX *)ctx_00;
            hVar18 = h2o_strdup((h2o_mem_pool_t *)0x0,paVar1->scalar,0xffffffffffffffff);
            plVar8->certificate_file = hVar18.base;
            SSL_CTX_callback_ctrl(ctx_00,0x3f,on_staple_ocsp_ossl);
            SSL_CTX_ctrl(ctx_00,0x40,0,plVar8);
            pthread_mutex_init((pthread_mutex_t *)&(plVar8->ocsp_stapling).response,
                               (pthread_mutexattr_t *)0x0);
            if (pyVar17 == (yoml_t_conflict *)0x0) {
              pcVar12 = "share/h2o/fetch-ocsp-response";
            }
            else {
              hVar18 = h2o_strdup((h2o_mem_pool_t *)0x0,(pyVar17->data).scalar,0xffffffffffffffff);
              pcVar12 = hVar18.base;
            }
            (plVar8->ocsp_stapling).cmd = pcVar12;
            if (conf.run_mode == RUN_MODE_WORKER) {
              (plVar8->ocsp_stapling).interval = 0x3840;
              (plVar8->ocsp_stapling).max_failures = 3;
              h2o_multithread_create_thread
                        (&(plVar8->ocsp_stapling).updater_tid,(pthread_attr_t *)0x0,
                         ocsp_updater_thread,plVar8);
            }
            else if (conf.run_mode == RUN_MODE_TEST) {
              fprintf(_stderr,"[OCSP Stapling] testing for certificate file:%s\n",paVar1->scalar);
              uVar7 = get_ocsp_response(paVar1->scalar,(plVar8->ocsp_stapling).cmd,local_138);
              if ((char)uVar7 == 'K') {
                pcVar12 = (local_1a8->data).scalar;
                pcVar11 = "[OCSP Stapling] temporary failed for file:%s\n";
              }
              else {
                if ((uVar7 & 0xff) == 0) {
                  listener_setup_ssl_cold_2();
                  goto LAB_0018de83;
                }
                pcVar12 = (local_1a8->data).scalar;
                pcVar11 = "[OCSP Stapling] does not work, will be disabled for file:%s\n";
              }
              h2o_configurator_errprintf(cmd,local_1a8,pcVar11,pcVar12);
            }
LAB_0018de83:
            if (bVar14 != 0) {
              return 0;
            }
            pcVar12 = listener_setup_ssl_picotls(listener,plVar8,(SSL_CTX *)ctx_00);
            if (pcVar12 != (char *)0x0) {
              h2o_configurator_errprintf(cmd,ssl_node,"%s; TLS 1.3 will be disabled\n",pcVar12);
              return 0;
            }
            return 0;
          }
          bp = BIO_new_file((local_190->data).scalar,"r");
          if (bp != (BIO *)0x0) {
            dh = PEM_read_bio_DHparams(bp,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
            BIO_free(bp);
            if (dh != (DH *)0x0) {
              SSL_CTX_ctrl(ctx_00,3,0,dh);
              SSL_CTX_set_options(ctx_00,0);
              DH_free(dh);
              goto LAB_0018dbc7;
            }
          }
          pcVar12 = (local_190->data).scalar;
          pcVar11 = "failed to load dhparam file:%s\n";
          local_170 = local_190;
          goto LAB_0018da50;
        }
        h2o_configurator_errprintf(cmd,local_158,"failed to setup SSL cipher suite\n");
      }
      else {
        pcVar12 = (local_1a8->data).scalar;
        pcVar11 = "failed to load certificate file:%s\n";
        local_170 = local_1a8;
LAB_0018da50:
        h2o_configurator_errprintf(cmd,local_170,pcVar11,pcVar12);
      }
      ERR_print_errors_cb(on_openssl_print_errors,_stderr);
LAB_0018da6d:
      if (ctx_00 != (SSL_CTX *)0x0) {
        SSL_CTX_free(ctx_00);
        return -1;
      }
      return -1;
    }
  }
  pcVar12 = "could not find mandatory property `certificate-file`";
LAB_0018d86a:
  h2o_configurator_errprintf(cmd,ssl_node,pcVar12);
  return -1;
}

Assistant:

static int listener_setup_ssl(h2o_configurator_command_t *cmd, h2o_configurator_context_t *ctx, yoml_t *listen_node,
                              yoml_t *ssl_node, struct listener_config_t *listener, int listener_is_new)
{
    SSL_CTX *ssl_ctx = NULL;
    yoml_t *certificate_file = NULL, *key_file = NULL, *dh_file = NULL, *min_version = NULL, *max_version = NULL,
           *cipher_suite = NULL, *ocsp_update_cmd = NULL, *ocsp_update_interval_node = NULL, *ocsp_max_failures_node = NULL;
    long ssl_options = SSL_OP_ALL;
    uint64_t ocsp_update_interval = 4 * 60 * 60; /* defaults to 4 hours */
    unsigned ocsp_max_failures = 3;              /* defaults to 3; permit 3 failures before temporary disabling OCSP stapling */
    int use_neverbleed = 1, use_picotls = 1;     /* enabled by default */

    if (!listener_is_new) {
        if (listener->ssl.size != 0 && ssl_node == NULL) {
            h2o_configurator_errprintf(cmd, listen_node, "cannot accept HTTP; already defined to accept HTTPS");
            return -1;
        }
        if (listener->ssl.size == 0 && ssl_node != NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "cannot accept HTTPS; already defined to accept HTTP");
            return -1;
        }
    }

    if (ssl_node == NULL)
        return 0;
    if (ssl_node->type != YOML_TYPE_MAPPING) {
        h2o_configurator_errprintf(cmd, ssl_node, "`ssl` is not a mapping");
        return -1;
    }

    { /* parse */
        size_t i;
        for (i = 0; i != ssl_node->data.sequence.size; ++i) {
            yoml_t *key = ssl_node->data.mapping.elements[i].key, *value = ssl_node->data.mapping.elements[i].value;
            /* obtain the target command */
            if (key->type != YOML_TYPE_SCALAR) {
                h2o_configurator_errprintf(NULL, key, "command must be a string");
                return -1;
            }
#define FETCH_PROPERTY(n, p)                                                                                                       \
    if (strcmp(key->data.scalar, n) == 0) {                                                                                        \
        if (value->type != YOML_TYPE_SCALAR) {                                                                                     \
            h2o_configurator_errprintf(cmd, value, "property of `" n "` must be a string");                                        \
            return -1;                                                                                                             \
        }                                                                                                                          \
        p = value;                                                                                                                 \
        continue;                                                                                                                  \
    }
            FETCH_PROPERTY("certificate-file", certificate_file);
            FETCH_PROPERTY("key-file", key_file);
            FETCH_PROPERTY("min-version", min_version);
            FETCH_PROPERTY("minimum-version", min_version);
            FETCH_PROPERTY("max-version", max_version);
            FETCH_PROPERTY("maximum-version", max_version);
            FETCH_PROPERTY("cipher-suite", cipher_suite);
            FETCH_PROPERTY("ocsp-update-cmd", ocsp_update_cmd);
            FETCH_PROPERTY("ocsp-update-interval", ocsp_update_interval_node);
            FETCH_PROPERTY("ocsp-max-failures", ocsp_max_failures_node);
            FETCH_PROPERTY("dh-file", dh_file);
            if (strcmp(key->data.scalar, "cipher-preference") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "client") == 0) {
                    ssl_options &= ~SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "server") == 0) {
                    ssl_options |= SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `cipher-preference` must be either of: `client`, `server`");
                    return -1;
                }
                continue;
            }
            if (strcmp(key->data.scalar, "neverbleed") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "ON") == 0) {
                    /* no need to enable neverbleed for daemon / master */
                    use_neverbleed = 1;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "OFF") == 0) {
                    use_neverbleed = 0;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `neverbleed` must be either of: `ON`, `OFF");
                    return -1;
                }
                continue;
            }
            h2o_configurator_errprintf(cmd, key, "unknown property: %s", key->data.scalar);
            return -1;
#undef FETCH_PROPERTY
        }
        if (certificate_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `certificate-file`");
            return -1;
        }
        if (key_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `key-file`");
            return -1;
        }
        if (min_version != NULL) {
#define MAP(tok, op)                                                                                                               \
    if (strcasecmp(min_version->data.scalar, tok) == 0) {                                                                          \
        ssl_options |= (op);                                                                                                       \
        goto VersionFound;                                                                                                         \
    }
            MAP("sslv2", 0);
            MAP("sslv3", SSL_OP_NO_SSLv2);
            MAP("tlsv1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
            MAP("tlsv1.1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1);
#ifdef SSL_OP_NO_TLSv1_1
            MAP("tlsv1.2", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1);
#endif
#ifdef SSL_OP_NO_TLSv1_2
            MAP("tlsv1.3", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1 | SSL_OP_NO_TLSv1_2);
#endif
#undef MAP
            h2o_configurator_errprintf(cmd, min_version, "unknown protocol version: %s", min_version->data.scalar);
        VersionFound:;
        } else {
            /* default is >= TLSv1 */
            ssl_options |= SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3;
        }
        if (max_version != NULL) {
            if (strcasecmp(max_version->data.scalar, "tlsv1.3") < 0)
                use_picotls = 0;
        }
        if (ocsp_update_interval_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_update_interval_node, "%" PRIu64, &ocsp_update_interval) != 0)
                goto Error;
        }
        if (ocsp_max_failures_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_max_failures_node, "%u", &ocsp_max_failures) != 0)
                goto Error;
        }
    }

    /* add the host to the existing SSL config, if the certificate file is already registered */
    if (ctx->hostconf != NULL) {
        size_t i;
        for (i = 0; i != listener->ssl.size; ++i) {
            struct listener_ssl_config_t *ssl_config = listener->ssl.entries[i];
            if (strcmp(ssl_config->certificate_file, certificate_file->data.scalar) == 0) {
                listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
                return 0;
            }
        }
    }

/* disable tls compression to avoid "CRIME" attacks (see http://en.wikipedia.org/wiki/CRIME) */
#ifdef SSL_OP_NO_COMPRESSION
    ssl_options |= SSL_OP_NO_COMPRESSION;
#endif

    /* setup */
    ssl_ctx = SSL_CTX_new(SSLv23_server_method());
    SSL_CTX_set_options(ssl_ctx, ssl_options);

    setup_ecc_key(ssl_ctx);
    if (SSL_CTX_use_certificate_chain_file(ssl_ctx, certificate_file->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, certificate_file, "failed to load certificate file:%s\n", certificate_file->data.scalar);
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (use_neverbleed) {
        /* disable neverbleed in case the process is not going to serve requests */
        switch (conf.run_mode) {
        case RUN_MODE_DAEMON:
        case RUN_MODE_MASTER:
            use_neverbleed = 0;
            break;
        default:
            break;
        }
    }
    if (use_neverbleed) {
        char errbuf[NEVERBLEED_ERRBUF_SIZE];
        if (neverbleed == NULL) {
            neverbleed = h2o_mem_alloc(sizeof(*neverbleed));
            if (neverbleed_init(neverbleed, errbuf) != 0) {
                fprintf(stderr, "%s\n", errbuf);
                abort();
            }
        }
        if (neverbleed_load_private_key_file(neverbleed, ssl_ctx, key_file->data.scalar, errbuf) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s:%s\n", key_file->data.scalar, errbuf);
            goto Error;
        }
    } else {
        if (SSL_CTX_use_PrivateKey_file(ssl_ctx, key_file->data.scalar, SSL_FILETYPE_PEM) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s\n", key_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
    }
    if (cipher_suite != NULL && SSL_CTX_set_cipher_list(ssl_ctx, cipher_suite->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, cipher_suite, "failed to setup SSL cipher suite\n");
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (dh_file != NULL) {
        BIO *bio = BIO_new_file(dh_file->data.scalar, "r");
        if (bio == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        DH *dh = PEM_read_bio_DHparams(bio, NULL, NULL, NULL);
        BIO_free(bio);
        if (dh == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        SSL_CTX_set_tmp_dh(ssl_ctx, dh);
        SSL_CTX_set_options(ssl_ctx, SSL_OP_SINGLE_DH_USE);
        DH_free(dh);
    }

/* setup protocol negotiation methods */
#if H2O_USE_NPN
    h2o_ssl_register_npn_protocols(ssl_ctx, h2o_npn_protocols);
#endif
#if H2O_USE_ALPN
    h2o_ssl_register_alpn_protocols(ssl_ctx, h2o_alpn_protocols);
#endif

    /* set SNI callback to the first SSL context, when and only when it should be used */
    if (listener->ssl.size == 1) {
        SSL_CTX_set_tlsext_servername_callback(listener->ssl.entries[0]->ctx, on_sni_callback);
        SSL_CTX_set_tlsext_servername_arg(listener->ssl.entries[0]->ctx, listener);
    }

    /* create a new entry in the SSL context list */
    struct listener_ssl_config_t *ssl_config = h2o_mem_alloc(sizeof(*ssl_config));
    memset(ssl_config, 0, sizeof(*ssl_config));
    h2o_vector_reserve(NULL, &listener->ssl, listener->ssl.size + 1);
    listener->ssl.entries[listener->ssl.size++] = ssl_config;
    if (ctx->hostconf != NULL) {
        listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
    }
    ssl_config->ctx = ssl_ctx;
    ssl_config->certificate_file = h2o_strdup(NULL, certificate_file->data.scalar, SIZE_MAX).base;

#if !H2O_USE_OCSP
    if (ocsp_update_interval != 0)
        fprintf(stderr, "[OCSP Stapling] disabled (not support by the SSL library)\n");
#else
#ifndef OPENSSL_NO_OCSP
    SSL_CTX_set_tlsext_status_cb(ssl_ctx, on_staple_ocsp_ossl);
    SSL_CTX_set_tlsext_status_arg(ssl_ctx, ssl_config);
#endif
    pthread_mutex_init(&ssl_config->ocsp_stapling.response.mutex, NULL);
    ssl_config->ocsp_stapling.cmd =
        ocsp_update_cmd != NULL ? h2o_strdup(NULL, ocsp_update_cmd->data.scalar, SIZE_MAX).base : "share/h2o/fetch-ocsp-response";
    if (ocsp_update_interval != 0) {
        switch (conf.run_mode) {
        case RUN_MODE_WORKER:
            ssl_config->ocsp_stapling.interval =
                ocsp_update_interval; /* is also used as a flag for indicating if the updater thread was spawned */
            ssl_config->ocsp_stapling.max_failures = ocsp_max_failures;
            h2o_multithread_create_thread(&ssl_config->ocsp_stapling.updater_tid, NULL, ocsp_updater_thread, ssl_config);
            break;
        case RUN_MODE_MASTER:
        case RUN_MODE_DAEMON:
            /* nothing to do */
            break;
        case RUN_MODE_TEST: {
            h2o_buffer_t *respbuf;
            fprintf(stderr, "[OCSP Stapling] testing for certificate file:%s\n", certificate_file->data.scalar);
            switch (get_ocsp_response(certificate_file->data.scalar, ssl_config->ocsp_stapling.cmd, &respbuf)) {
            case 0:
                h2o_buffer_dispose(&respbuf);
                fprintf(stderr, "[OCSP Stapling] stapling works for file:%s\n", certificate_file->data.scalar);
                break;
            case EX_TEMPFAIL:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] temporary failed for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            default:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] does not work, will be disabled for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            }
        } break;
        }
    }
#endif

#if H2O_USE_PICOTLS
    if (use_picotls) {
        const char *errstr = listener_setup_ssl_picotls(listener, ssl_config, ssl_ctx);
        if (errstr != NULL)
            h2o_configurator_errprintf(cmd, ssl_node, "%s; TLS 1.3 will be disabled\n", errstr);
    }
#endif

    return 0;

Error:
    if (ssl_ctx != NULL)
        SSL_CTX_free(ssl_ctx);
    return -1;
}